

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AssignEvaluator.h
# Opt level: O2

void Eigen::internal::
     call_dense_assignment_loop<Eigen::Block<Eigen::Matrix<float,_1,8,0,_1,8>,_1,1,true>,Eigen::Block<Eigen::Matrix<float,_1,8,0,_1,8>,_1,1,true>,Eigen::internal::swap_assign_op<float>>
               (Block<Eigen::Matrix<float,__1,_8,_0,__1,_8>,__1,_1,_true> *dst,
               Block<Eigen::Matrix<float,__1,_8,_0,__1,_8>,__1,_1,_true> *src,
               swap_assign_op<float> *func)

{
  DstEvaluatorType dstEvaluator;
  SrcEvaluatorType srcEvaluator;
  Kernel kernel;
  DstEvaluatorType local_68;
  SrcEvaluatorType local_50;
  generic_dense_assignment_kernel<Eigen::internal::evaluator<Eigen::Block<Eigen::Matrix<float,__1,_8,_0,__1,_8>,__1,_1,_true>_>,_Eigen::internal::evaluator<Eigen::Block<Eigen::Matrix<float,__1,_8,_0,__1,_8>,__1,_1,_true>_>,_Eigen::internal::swap_assign_op<float>,_0>
  local_38;
  
  local_50.super_block_evaluator<Eigen::Matrix<float,__1,_8,_0,__1,_8>,__1,_1,_true,_true>.
  super_mapbase_evaluator<Eigen::Block<Eigen::Matrix<float,__1,_8,_0,__1,_8>,__1,_1,_true>,_Eigen::Matrix<float,__1,_1,_0,__1,_1>_>
  .m_data = (src->super_BlockImpl<Eigen::Matrix<float,__1,_8,_0,__1,_8>,__1,_1,_true,_Eigen::Dense>)
            .super_BlockImpl_dense<Eigen::Matrix<float,__1,_8,_0,__1,_8>,__1,_1,_true,_true>.
            super_MapBase<Eigen::Block<Eigen::Matrix<float,__1,_8,_0,__1,_8>,__1,_1,_true>,_1>.
            super_MapBase<Eigen::Block<Eigen::Matrix<float,__1,_8,_0,__1,_8>,__1,_1,_true>,_0>.
            m_data;
  local_50.super_block_evaluator<Eigen::Matrix<float,__1,_8,_0,__1,_8>,__1,_1,_true,_true>.
  super_mapbase_evaluator<Eigen::Block<Eigen::Matrix<float,__1,_8,_0,__1,_8>,__1,_1,_true>,_Eigen::Matrix<float,__1,_1,_0,__1,_1>_>
  .m_outerStride.m_value =
       (((src->super_BlockImpl<Eigen::Matrix<float,__1,_8,_0,__1,_8>,__1,_1,_true,_Eigen::Dense>).
         super_BlockImpl_dense<Eigen::Matrix<float,__1,_8,_0,__1,_8>,__1,_1,_true,_true>.m_xpr)->
       super_PlainObjectBase<Eigen::Matrix<float,__1,_8,_0,__1,_8>_>).m_storage.m_rows;
  resize_if_allowed<Eigen::Block<Eigen::Matrix<float,_1,8,0,_1,8>,_1,1,true>,Eigen::Block<Eigen::Matrix<float,_1,8,0,_1,8>,_1,1,true>,Eigen::internal::swap_assign_op<float>>
            (dst,src,func);
  local_68.super_block_evaluator<Eigen::Matrix<float,__1,_8,_0,__1,_8>,__1,_1,_true,_true>.
  super_mapbase_evaluator<Eigen::Block<Eigen::Matrix<float,__1,_8,_0,__1,_8>,__1,_1,_true>,_Eigen::Matrix<float,__1,_1,_0,__1,_1>_>
  .m_data = (dst->super_BlockImpl<Eigen::Matrix<float,__1,_8,_0,__1,_8>,__1,_1,_true,_Eigen::Dense>)
            .super_BlockImpl_dense<Eigen::Matrix<float,__1,_8,_0,__1,_8>,__1,_1,_true,_true>.
            super_MapBase<Eigen::Block<Eigen::Matrix<float,__1,_8,_0,__1,_8>,__1,_1,_true>,_1>.
            super_MapBase<Eigen::Block<Eigen::Matrix<float,__1,_8,_0,__1,_8>,__1,_1,_true>,_0>.
            m_data;
  local_68.super_block_evaluator<Eigen::Matrix<float,__1,_8,_0,__1,_8>,__1,_1,_true,_true>.
  super_mapbase_evaluator<Eigen::Block<Eigen::Matrix<float,__1,_8,_0,__1,_8>,__1,_1,_true>,_Eigen::Matrix<float,__1,_1,_0,__1,_1>_>
  .m_outerStride.m_value =
       (((dst->super_BlockImpl<Eigen::Matrix<float,__1,_8,_0,__1,_8>,__1,_1,_true,_Eigen::Dense>).
         super_BlockImpl_dense<Eigen::Matrix<float,__1,_8,_0,__1,_8>,__1,_1,_true,_true>.m_xpr)->
       super_PlainObjectBase<Eigen::Matrix<float,__1,_8,_0,__1,_8>_>).m_storage.m_rows;
  local_38.
  super_generic_dense_assignment_kernel<Eigen::internal::evaluator<Eigen::Block<Eigen::Matrix<float,__1,_8,_0,__1,_8>,__1,_1,_true>_>,_Eigen::internal::evaluator<Eigen::Block<Eigen::Matrix<float,__1,_8,_0,__1,_8>,__1,_1,_true>_>,_Eigen::internal::swap_assign_op<float>,_1>
  .m_dst = &local_68;
  local_38.
  super_generic_dense_assignment_kernel<Eigen::internal::evaluator<Eigen::Block<Eigen::Matrix<float,__1,_8,_0,__1,_8>,__1,_1,_true>_>,_Eigen::internal::evaluator<Eigen::Block<Eigen::Matrix<float,__1,_8,_0,__1,_8>,__1,_1,_true>_>,_Eigen::internal::swap_assign_op<float>,_1>
  .m_src = &local_50;
  local_38.
  super_generic_dense_assignment_kernel<Eigen::internal::evaluator<Eigen::Block<Eigen::Matrix<float,__1,_8,_0,__1,_8>,__1,_1,_true>_>,_Eigen::internal::evaluator<Eigen::Block<Eigen::Matrix<float,__1,_8,_0,__1,_8>,__1,_1,_true>_>,_Eigen::internal::swap_assign_op<float>,_1>
  .m_functor = func;
  local_38.
  super_generic_dense_assignment_kernel<Eigen::internal::evaluator<Eigen::Block<Eigen::Matrix<float,__1,_8,_0,__1,_8>,__1,_1,_true>_>,_Eigen::internal::evaluator<Eigen::Block<Eigen::Matrix<float,__1,_8,_0,__1,_8>,__1,_1,_true>_>,_Eigen::internal::swap_assign_op<float>,_1>
  .m_dstExpr = dst;
  dense_assignment_loop<Eigen::internal::generic_dense_assignment_kernel<Eigen::internal::evaluator<Eigen::Block<Eigen::Matrix<float,_-1,_8,_0,_-1,_8>,_-1,_1,_true>_>,_Eigen::internal::evaluator<Eigen::Block<Eigen::Matrix<float,_-1,_8,_0,_-1,_8>,_-1,_1,_true>_>,_Eigen::internal::swap_assign_op<float>,_0>,_3,_0>
  ::run(&local_38);
  return;
}

Assistant:

EIGEN_DEVICE_FUNC EIGEN_STRONG_INLINE void call_dense_assignment_loop(DstXprType& dst, const SrcXprType& src, const Functor &func)
{
  typedef evaluator<DstXprType> DstEvaluatorType;
  typedef evaluator<SrcXprType> SrcEvaluatorType;

  SrcEvaluatorType srcEvaluator(src);

  // NOTE To properly handle A = (A*A.transpose())/s with A rectangular,
  // we need to resize the destination after the source evaluator has been created.
  resize_if_allowed(dst, src, func);

  DstEvaluatorType dstEvaluator(dst);

  typedef generic_dense_assignment_kernel<DstEvaluatorType,SrcEvaluatorType,Functor> Kernel;
  Kernel kernel(dstEvaluator, srcEvaluator, func, dst.const_cast_derived());

  dense_assignment_loop<Kernel>::run(kernel);
}